

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O0

uint8 GetFaceMask(S2ShapeIndex *index)

{
  byte bVar1;
  bool bVar2;
  S2CellId local_48;
  uint64 local_40;
  S2CellId local_38;
  uint local_30;
  int face;
  Iterator local_20;
  Iterator it;
  uint8 mask;
  S2ShapeIndex *index_local;
  
  it.iter_._M_t.
  super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
  ._M_t.
  super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
  .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl._7_1_ = 0;
  S2ShapeIndex::Iterator::Iterator(&local_20,index,BEGIN);
  while( true ) {
    bVar2 = S2ShapeIndex::Iterator::done(&local_20);
    bVar1 = it.iter_._M_t.
            super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
            ._M_t.
            super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
            .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl._7_1_;
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    local_38 = S2ShapeIndex::Iterator::id(&local_20);
    local_30 = S2CellId::face(&local_38);
    it.iter_._M_t.
    super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
    ._M_t.
    super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
    .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl._7_1_ =
         it.iter_._M_t.
         super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
         ._M_t.
         super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
         .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl._7_1_ |
         (byte)(1 << (local_30 & 0x1f));
    local_48 = S2CellId::FromFace(local_30 + 1);
    local_40 = (uint64)S2CellId::range_min(&local_48);
    S2ShapeIndex::Iterator::Seek(&local_20,(S2CellId)local_40);
  }
  S2ShapeIndex::Iterator::~Iterator(&local_20);
  return bVar1;
}

Assistant:

uint8 GetFaceMask(const S2ShapeIndex& index) {
  uint8 mask = 0;
  S2ShapeIndex::Iterator it(&index, S2ShapeIndex::BEGIN);
  while (!it.done()) {
    int face = it.id().face();
    mask |= 1 << face;
    it.Seek(S2CellId::FromFace(face + 1).range_min());
  }
  return mask;
}